

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void tun_flushwrite(handler *h)

{
  ringbuf *prVar1;
  long lVar2;
  trans2p *ptVar3;
  uint16_t uVar4;
  ushort uVar5;
  bool bVar6;
  
  ptVar3 = h->t;
  uVar4 = (ptVar3->tun).write.sz;
  if (uVar4 != 0) {
    uVar5 = (ptVar3->tun).write.idx;
    do {
      bVar6 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      if (bVar6) {
        uVar5 = 0x17;
      }
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    lVar2 = (ulong)uVar5 * 0x10000 + (ulong)uVar5 * 2;
    tun_ringbuf_write((ptVar3->tun).write.buffs[0].buf + lVar2,
                      *(uint16_t *)((ptVar3->tun).write.buffs[0].buf + lVar2 + -2),&ptVar3->tun);
    prVar1 = &(ptVar3->tun).write;
    prVar1->sz = prVar1->sz - 1;
  }
  return;
}

Assistant:

void tun_flushwrite(struct handler * h)
{
  struct tunif * tun = &h->t->tun;
  ringbuf_pop(&tun->write, &tun_ringbuf_write, tun);
}